

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

EColorRange V_ParseFontColor(BYTE **color_value,int normalcolor,int boldcolor)

{
  byte bVar1;
  EColorRange EVar2;
  uint uVar3;
  long lVar4;
  byte *text;
  byte *pbVar5;
  FName local_14;
  
  bVar1 = **color_value;
  text = *color_value + 1;
  EVar2 = PrintColors[4];
  if ((((bVar1 != 0x21) && (EVar2 = PrintColors[3], bVar1 != 0x2a)) &&
      (uVar3 = (uint)bVar1, EVar2 = boldcolor, uVar3 != 0x2b)) &&
     (EVar2 = normalcolor, uVar3 != 0x2d)) {
    if (uVar3 == 0x5b) {
      lVar4 = 0;
      for (pbVar5 = text; (*pbVar5 != 0 && (*pbVar5 != 0x5d)); pbVar5 = pbVar5 + 1) {
        lVar4 = lVar4 + 0x100000000;
      }
      FName::NameManager::FindName(&FName::NameData,(char *)text,lVar4 >> 0x20,true);
      text = pbVar5 + (*pbVar5 != 0);
      EVar2 = V_FindFontColor(&local_14);
    }
    else if ((byte)(bVar1 + 0xbf) < 0x16) {
      EVar2 = (uint)bVar1 + 0xffffffbf;
    }
    else if ((byte)(bVar1 + 0x9f) < 0x16) {
      EVar2 = uVar3 + 0xffffff9f;
    }
    else {
      text = text + -(ulong)(*text == 0);
      EVar2 = CR_UNDEFINED;
    }
  }
  *color_value = text;
  return EVar2;
}

Assistant:

EColorRange V_ParseFontColor (const BYTE *&color_value, int normalcolor, int boldcolor)
{
	const BYTE *ch = color_value;
	int newcolor = *ch++;

	if (newcolor == '-')			// Normal
	{
		newcolor = normalcolor;
	}
	else if (newcolor == '+')		// Bold
	{
		newcolor = boldcolor;
	}
	else if (newcolor == '!')		// Team chat
	{
		newcolor = PrintColors[PRINT_TEAMCHAT];
	}
	else if (newcolor == '*')		// Chat
	{
		newcolor = PrintColors[PRINT_CHAT];
	}
	else if (newcolor == '[')		// Named
	{
		const BYTE *namestart = ch;
		while (*ch != ']' && *ch != '\0')
		{
			ch++;
		}
		FName rangename((const char *)namestart, int(ch - namestart), true);
		if (*ch != '\0')
		{
			ch++;
		}
		newcolor = V_FindFontColor (rangename);
	}
	else if (newcolor >= 'A' && newcolor < NUM_TEXT_COLORS + 'A')	// Standard, uppercase
	{
		newcolor -= 'A';
	}
	else if (newcolor >= 'a' && newcolor < NUM_TEXT_COLORS + 'a')	// Standard, lowercase
	{
		newcolor -= 'a';
	}
	else							// Incomplete!
	{
		color_value = ch - (*ch == '\0');
		return CR_UNDEFINED;
	}
	color_value = ch;
	return EColorRange(newcolor);
}